

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O2

TString * __thiscall
glslang::TIntermOperator::getCompleteString_abi_cxx11_
          (TString *__return_storage_ptr__,TIntermOperator *this)

{
  TString name;
  pool_allocator<char> pVar1;
  pool_allocator<char> pVar2;
  char *__s;
  TPrecisionQualifier p;
  undefined8 in_stack_ffffffffffffff68;
  TString in_stack_ffffffffffffff80;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  pVar1.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            (local_58,"",(pool_allocator<char> *)&stack0xffffffffffffff78);
  pVar2.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &stack0xffffffffffffff80,"",(pool_allocator<char> *)&stack0xffffffffffffff70);
  name._M_dataplus._M_p = (pointer)&stack0xffffffffffffff80;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
  name._M_string_length = in_stack_ffffffffffffff68;
  name.field_2._M_allocated_capacity = (size_type)pVar2.allocator;
  name.field_2._8_8_ = pVar1.allocator;
  TType::getCompleteString
            (__return_storage_ptr__,&(this->super_TIntermTyped).type,false,true,true,true,name,
             in_stack_ffffffffffffff80);
  if ((this->operationPrecision != EpqNone) &&
     (this->operationPrecision !=
      (*(uint *)&(this->super_TIntermTyped).type.qualifier.field_0x8 >> 0x19 & 7))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (__return_storage_ptr__,", operation at ");
    p = *(uint *)&(this->super_TIntermTyped).type.qualifier.field_0x8 >> 0x19 & 7;
    if (this->operationPrecision != EpqNone) {
      p = this->operationPrecision;
    }
    __s = GetPrecisionQualifierString(p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (__return_storage_ptr__,__s);
  }
  return __return_storage_ptr__;
}

Assistant:

TString getCompleteString() const
    {
        TString cs = type.getCompleteString();
        if (getOperationPrecision() != type.getQualifier().precision) {
            cs += ", operation at ";
            cs += GetPrecisionQualifierString(getOperationPrecision());
        }

        return cs;
    }